

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
 __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
iterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::Literal*>
          (SubstitutionTree<Indexing::LiteralClause> *this,Literal *query,bool retrieveSubstitutions
          ,bool reversed)

{
  long *plVar1;
  Self SVar2;
  char cVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000011;
  undefined8 uVar5;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *p;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88 [16];
  IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
  local_78;
  undefined8 local_68;
  undefined8 local_60;
  Literal *local_58;
  undefined1 local_50 [16];
  undefined8 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  
  uVar5._1_7_ = in_register_00000011;
  uVar5._0_1_ = retrieveSubstitutions;
  plVar1 = *(long **)&(query->super_Term)._functor;
  if ((plVar1 != (long *)0x0) && (cVar3 = (**(code **)(*plVar1 + 0x18))(), cVar3 == '\0')) {
    local_60 = *(undefined8 *)&(query->super_Term)._functor;
    local_50._0_8_ = &local_58;
    local_50._8_8_ = &local_60;
    local_40 = &local_68;
    local_38 = &local_89;
    local_30 = &local_8a;
    local_89 = reversed;
    local_68 = uVar5;
    local_58 = query;
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*,_Kernel::Literal_*,_bool,_bool>
    ::anon_class_40_5_898dd9c1::operator()((anon_class_40_5_898dd9c1 *)local_88);
    Lib::
    iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              (&local_78,(Lib *)local_88,p);
    puVar4 = (undefined8 *)
             Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    SVar2._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl =
         local_78._iter._p._self._M_t.
         super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         .
         super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
         ._M_head_impl;
    local_78._iter._p._self._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            )0x0;
    *puVar4 = &PTR__ProxyIterator_00b28d78;
    ((_Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
      *)(puVar4 + 2))->_M_head_impl =
         (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)SVar2._M_t.
            super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            .
            super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
            ._M_head_impl;
    local_50._0_8_ =
         (__uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
          )0x0;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)(puVar4 + 1) = 1;
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)local_50);
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_78);
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)local_88);
    return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
            )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
              *)this;
  }
  Lib::
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  ::getEmpty();
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
            *)this;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }